

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

double __thiscall
soplex::SPxScaler<double>::upperUnscaled(SPxScaler<double> *this,SPxLPBase<double> *lp,int i)

{
  double dVar1;
  double *pdVar2;
  int in_EDX;
  long in_RSI;
  DataArray<int> *colscaleExp;
  undefined8 in_stack_ffffffffffffffc8;
  int i_00;
  LPColSetBase<double> *in_stack_ffffffffffffffd0;
  LPColSetBase<double> *this_00;
  undefined8 local_8;
  
  i_00 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pdVar2 = LPColSetBase<double>::upper(in_stack_ffffffffffffffd0,i_00);
  this_00 = (LPColSetBase<double> *)*pdVar2;
  pdVar2 = (double *)infinity();
  if (*pdVar2 <= (double)this_00) {
    pdVar2 = LPColSetBase<double>::upper(this_00,i_00);
    local_8 = *pdVar2;
  }
  else {
    pdVar2 = LPColSetBase<double>::upper(this_00,i_00);
    dVar1 = *pdVar2;
    DataArray<int>::operator[]((DataArray<int> *)(in_RSI + 0x178),in_EDX);
    local_8 = spxLdexp((Real)this_00,(int)((ulong)dVar1 >> 0x20));
  }
  return local_8;
}

Assistant:

R SPxScaler<R>::upperUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(lp.isScaled());
   assert(i < lp.nCols());
   assert(i >= 0);

   if(lp.LPColSetBase<R>::upper(i) < R(infinity))
   {
      const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
      return spxLdexp(lp.LPColSetBase<R>::upper(i), colscaleExp[i]);
   }
   else
      return lp.LPColSetBase<R>::upper(i);
}